

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.h
# Opt level: O3

void idx2::ReadLines<256>(FILE *Fp,array<idx2::stack_array<char,_256>_> *Lines)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  stref Dst;
  stref Src;
  char Temp [256];
  anon_union_8_2_2df48d06_for_stref_0 local_158;
  undefined4 local_150;
  anon_union_8_2_2df48d06_for_stref_0 local_148;
  undefined4 local_140;
  char local_138 [264];
  
  pcVar1 = fgets(local_138,0x100,(FILE *)Fp);
  if (pcVar1 != (char *)0x0) {
    do {
      local_148.Ptr = local_138;
      sVar2 = strlen(local_138);
      local_140 = (undefined4)sVar2;
      if (local_138[(long)((sVar2 << 0x20) + -0x100000000) >> 0x20] == '\n') {
        local_138[(long)((sVar2 << 0x20) + -0x200000000) >> 0x20] = '\0';
      }
      lVar3 = Lines->Size;
      if (Lines->Capacity <= lVar3) {
        GrowCapacity<idx2::stack_array<char,256>>(Lines,0);
        lVar3 = Lines->Size;
      }
      Lines->Size = lVar3 + 1;
      local_158.Ptr = (str)((Lines->Buffer).Data + lVar3 * 0x101);
      local_150 = 0x100;
      Copy((stref *)&local_148,(stref *)&local_158,true);
      pcVar1 = fgets(local_138,0x100,(FILE *)Fp);
    } while (pcVar1 != (char *)0x0);
  }
  return;
}

Assistant:

void
ReadLines(FILE* Fp, array<stack_array<char, N>>* Lines)
{
  while (true)
  {
    char Temp[N];
    if (!fgets(Temp, N, Fp))
      return;

    stref Src(Temp);
    if (Temp[Src.Size - 1] == '\n')
      Temp[Src.Size - 2] = 0; // override the new line character
    PushBack(Lines);
    stref Dst(Back(*Lines).Arr, N);
    Copy(Src, &Dst, true);
  }
}